

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

bool_t memIsZero(void *buf,size_t count)

{
  word diff;
  size_t count_local;
  void *buf_local;
  
  diff = 0;
  buf_local = buf;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    diff = *buf_local | diff;
    buf_local = (void *)((long)buf_local + 8);
  }
  while (count_local != 0) {
    diff = *buf_local | diff;
    buf_local = (void *)((long)buf_local + 1);
    count_local = count_local - 1;
  }
  return (bool_t)(diff == 0);
}

Assistant:

bool_t SAFE(memIsZero)(const void* buf, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf;
		buf = (const word*)buf + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf;
		buf = (const octet*)buf + 1;
	}
	return (bool_t)wordEq(diff, 0);
}